

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O1

void Bac_ObjSetFanin(Bac_Ntk_t *p,int i,int x)

{
  if ((i < 0) || ((p->vType).nSize <= i)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
  if (((p->vType).pArray[(uint)i] & 0xfcU) != 4) {
    __assert_fail("Bac_ObjIsCo(p, i)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/bac/bac.h"
                  ,0x11d,"int Bac_ObjFanin(Bac_Ntk_t *, int)");
  }
  if (i < (p->vFanin).nSize) {
    if ((p->vFanin).pArray[(uint)i] != -1) {
      __assert_fail("Bac_ObjFanin(p, i) == -1 && Bac_ObjIsCo(p, i)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/bac/bac.h"
                    ,0x12a,"void Bac_ObjSetFanin(Bac_Ntk_t *, int, int)");
    }
    Vec_IntFillExtra(&p->vFanin,i + 1,0);
    if (i < (p->vFanin).nSize) {
      (p->vFanin).pArray[(uint)i] = x;
      return;
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline void           Bac_ObjSetFanin( Bac_Ntk_t * p, int i, int x )  { assert(Bac_ObjFanin(p, i) == -1 && Bac_ObjIsCo(p, i)); Vec_IntSetEntry( &p->vFanin, i, x);  }